

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O0

bool __thiscall Teleport::Stream::Read(Stream *this,float *val)

{
  int iVar1;
  int local_34;
  int r;
  float *val_local;
  Stream *this_local;
  
  iVar1 = this->readpos;
  if (iVar1 == this->writepos) {
    this_local._7_1_ = false;
  }
  else {
    if (iVar1 == 0x15887) {
      local_34 = 0;
    }
    else {
      local_34 = iVar1 + 1;
    }
    this->readpos = local_34;
    *val = this->buffer[iVar1];
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Read(float& val)
        {
            int r = readpos;
            if (r == writepos)
                return false;
            readpos = (r == LENGTH - 1) ? 0 : (r + 1);
            val = buffer[r];
            return true;
        }